

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O3

bool __thiscall
absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144> AVar1;
  FormatSinkImpl *sink;
  
  if (((ulong)arg.ptr & 0xff) != 0x13) {
    sink = (FormatSinkImpl *)(2L << (arg.buf[0] & 0x3f));
    if (((ulong)sink & 0x80004) != 0) {
      AVar1 = str_format_internal::FormatConvertImpl
                        ((str_format_internal *)this,(string *)arg.ptr,spec,sink);
      goto LAB_00107c36;
    }
  }
  AVar1.value = false;
LAB_00107c36:
  return (bool)(AVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }